

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh2_client.cc
# Opt level: O2

void __thiscall
common::SSH2Client::SSH2Client
          (SSH2Client *this,string *user,string *password,string *ip,uint16_t port,string *alias)

{
  std::__cxx11::string::string((string *)this,(string *)user);
  std::__cxx11::string::string((string *)&this->m_password,(string *)password);
  std::__cxx11::string::string((string *)&this->m_ip,(string *)ip);
  this->m_port = port;
  std::__cxx11::string::string((string *)&this->m_alias,(string *)alias);
  this->session = (LIBSSH2_SESSION *)0x0;
  this->channel = (LIBSSH2_CHANNEL *)0x0;
  return;
}

Assistant:

SSH2Client::SSH2Client(std::string user, std::string password,
    std::string ip, uint16_t port, std::string alias) :
    m_user(user), m_password(password), m_ip(ip), m_port(port), m_alias(alias) {
}